

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-misc.cc
# Opt level: O0

void demo_binary(void)

{
  ostream *poVar1;
  allocator<char> local_2f1;
  string local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  double local_268;
  double local_260;
  double local_258;
  double theta;
  double alpha;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> xy_pts_B;
  double y;
  double x;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> xy_pts_A;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  Gnuplot gp;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
  gnuplotio::Gnuplot::Gnuplot((Gnuplot *)local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&x);
  for (y = -2.0; y < 2.0; y = y + 0.01) {
    xy_pts_B.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(y * y * y);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double&,double&>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&x,&y,
               (double *)
               &xy_pts_B.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &alpha);
  for (theta = 0.0; theta < 1.0; theta = theta + 0.041666666666666664) {
    local_258 = (theta + theta) * 3.14159;
    local_260 = cos(local_258);
    local_268 = sin(local_258);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&alpha,
               &local_260,&local_268);
  }
  std::operator<<((ostream *)local_1d0,"set xrange [-2:2]\nset yrange [-2:2]\n");
  poVar1 = std::operator<<((ostream *)local_1d0,"plot \'-\' binary");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"record",&local_2a9);
  gnuplotio::Gnuplot::
  binFmt1d<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
            (&local_288,(Gnuplot *)local_1d0,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&x,
             &local_2a8);
  poVar1 = std::operator<<(poVar1,(string *)&local_288);
  poVar1 = std::operator<<(poVar1,"with lines title \'cubic\',");
  poVar1 = std::operator<<(poVar1,"\'-\' binary");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"record",&local_2f1);
  gnuplotio::Gnuplot::
  binFmt1d<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
            (&local_2d0,(Gnuplot *)local_1d0,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &alpha,&local_2f0);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  std::operator<<(poVar1,"with points title \'circle\'\n");
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  gnuplotio::Gnuplot::
  sendBinary1d<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
            ((Gnuplot *)local_1d0,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&x);
  gnuplotio::Gnuplot::
  sendBinary1d<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>
            ((Gnuplot *)local_1d0,
             (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &alpha);
  pause_if_needed();
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             &alpha);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)&x);
  gnuplotio::Gnuplot::~Gnuplot((Gnuplot *)local_1d0);
  return;
}

Assistant:

void demo_binary() {
    Gnuplot gp;

    std::vector<std::pair<double, double>> xy_pts_A;
    for(double x=-2; x<2; x+=0.01) {
        double y = x*x*x;
        xy_pts_A.emplace_back(x, y);
    }

    std::vector<std::pair<double, double>> xy_pts_B;
    for(double alpha=0; alpha<1; alpha+=1.0/24.0) {
        double theta = alpha*2.0*3.14159;
        xy_pts_B.emplace_back(cos(theta), sin(theta));
    }

    gp << "set xrange [-2:2]\nset yrange [-2:2]\n";
    gp << "plot '-' binary" << gp.binFmt1d(xy_pts_A, "record") << "with lines title 'cubic',"
        << "'-' binary" << gp.binFmt1d(xy_pts_B, "record") << "with points title 'circle'\n";
    gp.sendBinary1d(xy_pts_A);
    gp.sendBinary1d(xy_pts_B);

    pause_if_needed();
}